

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm_all.cc
# Opt level: O2

void __thiscall
cnn::TreeLSTMAllBuilder::start_new_sequence_impl
          (TreeLSTMAllBuilder *this,
          vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *hinit)

{
  uint uVar1;
  pointer pEVar2;
  pointer pEVar3;
  pointer pEVar4;
  bool bVar5;
  long lVar6;
  uint i;
  ulong uVar7;
  uint uVar8;
  
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear(&this->h);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear(&this->c);
  lVar6 = (long)(hinit->
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(hinit->
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar6 == 0) {
    bVar5 = false;
  }
  else {
    if (lVar6 >> 4 != (ulong)(this->layers * 2)) {
      __assert_fail("layers*2 == hinit.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/treelstm_all.cc"
                    ,0x7c,
                    "virtual void cnn::TreeLSTMAllBuilder::start_new_sequence_impl(const vector<Expression> &)"
                   );
    }
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (&this->h0,(ulong)this->layers);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (&this->c0,(ulong)this->layers);
    uVar1 = this->layers;
    pEVar2 = (hinit->
             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pEVar3 = (this->h0).
             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar4 = (this->c0).
             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar6 = 8;
    for (uVar7 = 0; uVar7 < uVar1; uVar7 = uVar7 + 1) {
      *(undefined8 *)((long)pEVar4 + lVar6 + -8) = *(undefined8 *)((long)pEVar2 + lVar6 + -8);
      *(undefined4 *)((long)&pEVar4->pg + lVar6) = *(undefined4 *)((long)&pEVar2->pg + lVar6);
      uVar8 = uVar1 + (int)uVar7;
      *(ComputationGraph **)((long)pEVar3 + lVar6 + -8) = pEVar2[uVar8].pg;
      *(uint *)((long)&pEVar3->pg + lVar6) = pEVar2[uVar8].i.t;
      lVar6 = lVar6 + 0x10;
    }
    bVar5 = true;
  }
  this->has_initial_state = bVar5;
  return;
}

Assistant:

void TreeLSTMAllBuilder::start_new_sequence_impl(const vector<Expression>& hinit) {
  h.clear();
  c.clear();
  if (hinit.size() > 0) {
    assert(layers*2 == hinit.size());
    h0.resize(layers);
    c0.resize(layers);
    for (unsigned i = 0; i < layers; ++i) {
      c0[i] = hinit[i];
      h0[i] = hinit[i + layers];
    }
    has_initial_state = true;
  } else {
    has_initial_state = false;
  }
}